

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O1

Debug * Corrade::Utility::operator<<(Debug *debug,Flag value)

{
  int iVar1;
  Debug *pDVar2;
  undefined7 in_register_00000031;
  char *local_18;
  
  iVar1 = (int)CONCAT71(in_register_00000031,value);
  switch(iVar1) {
  case 1:
    local_18 = "Utility::Debug::Flag::NoNewlineAtTheEnd";
    break;
  case 2:
    local_18 = "Utility::Debug::Flag::DisableColors";
    break;
  case 4:
    local_18 = "Utility::Debug::Flag::NoSpace";
    break;
  case 8:
    local_18 = "Utility::Debug::Flag::Packed";
    break;
  default:
    if (iVar1 == 0x10) {
      local_18 = "Utility::Debug::Flag::Color";
      break;
    }
    if (iVar1 == 0x80) {
      local_18 = "Utility::Debug::Flag::Hex";
      break;
    }
  case 3:
  case 5:
  case 6:
  case 7:
    local_18 = "Utility::Debug::Flag(";
    pDVar2 = Debug::print<char_const*>(debug,&local_18);
    (pDVar2->_immediateFlags)._value = (pDVar2->_immediateFlags)._value | 0x84;
    debug = Debug::operator<<(pDVar2,value);
    (debug->_immediateFlags)._value = (debug->_immediateFlags)._value | 4;
    local_18 = ")";
  }
  pDVar2 = Debug::print<char_const*>(debug,&local_18);
  return pDVar2;
}

Assistant:

Debug& operator<<(Debug& debug, Debug::Flag value) {
    switch(value) {
        /* LCOV_EXCL_START */
        #define _c(value) case Debug::Flag::value: return debug << "Utility::Debug::Flag::" #value;
        _c(NoNewlineAtTheEnd)
        _c(DisableColors)
        _c(NoSpace)
        _c(Packed)
        _c(Color)
        /* Space reserved for Bin and Oct */
        _c(Hex)
        #undef _c
        /* LCOV_EXCL_STOP */
    }

    return debug << "Utility::Debug::Flag(" << Debug::nospace << Debug::hex << static_cast<unsigned char>(value) << Debug::nospace << ")";
}